

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O3

int mbedtls_gcm_setkey(mbedtls_gcm_context *ctx,mbedtls_cipher_id_t cipher,uchar *key,uint keybits)

{
  int iVar1;
  mbedtls_cipher_info_t *cipher_info;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  uchar h [16];
  size_t olen;
  ulong local_38;
  ulong uStack_30;
  size_t local_28;
  
  cipher_info = mbedtls_cipher_info_from_values(cipher,keybits,MBEDTLS_MODE_ECB);
  iVar1 = -0x14;
  if ((cipher_info != (mbedtls_cipher_info_t *)0x0) && (cipher_info->block_size == 0x10)) {
    mbedtls_cipher_free(&ctx->cipher_ctx);
    iVar1 = mbedtls_cipher_setup(&ctx->cipher_ctx,cipher_info);
    if (iVar1 == 0) {
      iVar1 = mbedtls_cipher_setkey(&ctx->cipher_ctx,key,keybits,MBEDTLS_ENCRYPT);
      if (iVar1 == 0) {
        local_28 = 0;
        local_38 = 0;
        uStack_30 = 0;
        iVar1 = mbedtls_cipher_update
                          (&ctx->cipher_ctx,(uchar *)&local_38,0x10,(uchar *)&local_38,&local_28);
        if (iVar1 == 0) {
          uVar6 = local_38 >> 0x38 | (local_38 & 0xff000000000000) >> 0x28 |
                  (local_38 & 0xff0000000000) >> 0x18 | (local_38 & 0xff00000000) >> 8 |
                  (local_38 & 0xff000000) << 8 | (local_38 & 0xff0000) << 0x18 |
                  (local_38 & 0xff00) << 0x28 | local_38 << 0x38;
          uVar7 = uStack_30 >> 0x38 | (uStack_30 & 0xff000000000000) >> 0x28 |
                  (uStack_30 & 0xff0000000000) >> 0x18 | (uStack_30 & 0xff00000000) >> 8 |
                  (uStack_30 & 0xff000000) << 8 | (uStack_30 & 0xff0000) << 0x18 |
                  (uStack_30 & 0xff00) << 0x28 | uStack_30 << 0x38;
          ctx->HL[8] = uVar7;
          ctx->HH[8] = uVar6;
          iVar1 = mbedtls_aesni_has_support(2);
          if (iVar1 == 0) {
            ctx->HH[0] = 0;
            ctx->HL[0] = 0;
            uVar3 = 4;
            do {
              uVar2 = uVar7 >> 1 | uVar6 << 0x3f;
              uVar4 = 0;
              if ((uVar7 & 1) != 0) {
                uVar4 = 0xe100000000000000;
              }
              uVar6 = uVar6 >> 1 ^ uVar4;
              ctx->HL[uVar3] = uVar2;
              ctx->HH[uVar3] = uVar6;
              bVar8 = 1 < uVar3;
              uVar7 = uVar2;
              uVar3 = uVar3 >> 1;
            } while (bVar8);
            uVar3 = 2;
            do {
              uVar2 = (ulong)uVar3;
              uVar7 = ctx->HL[uVar2];
              uVar6 = ctx->HH[uVar2];
              lVar5 = 0;
              do {
                ctx->HH[uVar2 + lVar5 + 1] = ctx->HH[lVar5 + 1] ^ uVar6;
                ctx->HL[uVar2 + lVar5 + 1] = ctx->HL[lVar5 + 1] ^ uVar7;
                lVar5 = lVar5 + 1;
              } while (uVar2 - 1 != lVar5);
              bVar8 = uVar3 < 5;
              uVar3 = uVar3 * 2;
            } while (bVar8);
          }
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_setkey( mbedtls_gcm_context *ctx,
                        mbedtls_cipher_id_t cipher,
                        const unsigned char *key,
                        unsigned int keybits )
{
    int ret;
    const mbedtls_cipher_info_t *cipher_info;

    cipher_info = mbedtls_cipher_info_from_values( cipher, keybits, MBEDTLS_MODE_ECB );
    if( cipher_info == NULL )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    if( cipher_info->block_size != 16 )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    mbedtls_cipher_free( &ctx->cipher_ctx );

    if( ( ret = mbedtls_cipher_setup( &ctx->cipher_ctx, cipher_info ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_setkey( &ctx->cipher_ctx, key, keybits,
                               MBEDTLS_ENCRYPT ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = gcm_gen_table( ctx ) ) != 0 )
        return( ret );

    return( 0 );
}